

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O0

int32_t __thiscall
webrtc::TraceImpl::AddMessage(TraceImpl *this,char *trace_message,char *msg,uint16_t written_so_far)

{
  int local_30;
  int length;
  uint16_t written_so_far_local;
  char *msg_local;
  char *trace_message_local;
  TraceImpl *this_local;
  
  if (written_so_far < 0x400) {
    local_30 = snprintf(trace_message,(long)(int)(0x3fe - (uint)written_so_far),"%s",msg);
    if ((local_30 < 0) || ((int)(0x3fe - (uint)written_so_far) < local_30)) {
      local_30 = 0x3fe - (uint)written_so_far;
      trace_message[local_30] = '\0';
    }
    this_local._4_4_ = local_30 + 1;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t TraceImpl::AddMessage(
    char* trace_message,
    const char msg[WEBRTC_TRACE_MAX_MESSAGE_SIZE],
    const uint16_t written_so_far) const {
  int length = 0;
  if (written_so_far >= WEBRTC_TRACE_MAX_MESSAGE_SIZE) {
    return -1;
  }
  // - 2 to leave room for newline and NULL termination.
#ifdef _WIN32
  length = _snprintf(trace_message,
                     WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2,
                     "%s", msg);
  if (length < 0) {
    length = WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2;
    trace_message[length] = 0;
  }
#else
  length = snprintf(trace_message,
                    WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2,
                    "%s", msg);
  if (length < 0 ||
      length > WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2) {
    length = WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2;
    trace_message[length] = 0;
  }
#endif
  // Length with NULL termination.
  return length + 1;
}